

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer2.c
# Opt level: O1

ktx_error_code_e ktxTexture2_DeflateZstd(ktxTexture2 *This,ktx_uint32_t compressionLevel)

{
  ktxTexture2_private *pkVar1;
  uint uVar2;
  ZSTD_ErrorCode ZVar3;
  ZSTD_CCtx *cctx;
  size_t sVar4;
  void *__ptr;
  ulong uVar5;
  ktx_uint8_t *__dest;
  int iVar6;
  ktxLevelIndexEntry *__dest_00;
  ktx_uint32_t kVar7;
  ktx_uint64_t *pkVar8;
  size_t dstCapacity;
  long lVar9;
  ulong __n;
  long lVar10;
  bool bVar11;
  ktx_error_code_e local_74;
  size_t local_48;
  
  kVar7 = This->numLevels;
  pkVar1 = This->_private;
  cctx = ZSTD_createCCtx();
  if (cctx == (ZSTD_CCtx *)0x0) {
LAB_0026395d:
    local_74 = KTX_OUT_OF_MEMORY;
  }
  else {
    if (This->supercompressionScheme != KTX_SS_BEGIN_RANGE) {
      return KTX_INVALID_OPERATION;
    }
    uVar2 = This->numLevels - 1;
    if ((int)uVar2 < 0) {
      dstCapacity = 0;
    }
    else {
      pkVar8 = &pkVar1->_levelIndex[uVar2].byteLength;
      dstCapacity = 0;
      lVar10 = (ulong)uVar2 + 1;
      do {
        sVar4 = ZSTD_compressBound(*pkVar8);
        dstCapacity = dstCapacity + sVar4;
        pkVar8 = pkVar8 + -3;
        lVar9 = lVar10 + -1;
        bVar11 = 0 < lVar10;
        lVar10 = lVar9;
      } while (lVar9 != 0 && bVar11);
    }
    __n = (ulong)(kVar7 * 0x18);
    __ptr = malloc(__n + dstCapacity);
    if (__ptr == (void *)0x0) {
      local_74 = KTX_OUT_OF_MEMORY;
    }
    else {
      __dest_00 = pkVar1->_levelIndex;
      kVar7 = This->numLevels;
      lVar10 = 0;
      local_48 = 0;
      do {
        kVar7 = kVar7 - 1;
        if ((int)kVar7 < 0) {
          iVar6 = 6;
          break;
        }
        uVar5 = (ulong)(kVar7 & 0x7fffffff);
        sVar4 = ZSTD_compressCCtx(cctx,(void *)((long)((long)__ptr + __n) + lVar10),dstCapacity,
                                  This->pData + __dest_00[uVar5].byteOffset,
                                  pkVar1->_levelIndex[uVar5].byteLength,compressionLevel);
        uVar2 = ZSTD_isError(sVar4);
        if (uVar2 == 0) {
          *(long *)((long)__ptr + uVar5 * 0x18) = lVar10;
          *(ktx_uint64_t *)((long)__ptr + uVar5 * 0x18 + 0x10) = __dest_00[uVar5].byteLength;
          *(size_t *)((long)__ptr + uVar5 * 0x18 + 8) = sVar4;
          local_48 = local_48 + sVar4;
          lVar10 = lVar10 + sVar4;
          dstCapacity = dstCapacity - sVar4;
          iVar6 = 0;
        }
        else {
          free(__ptr);
          ZVar3 = ZSTD_getErrorCode(sVar4);
          iVar6 = 5;
          if ((int)ZVar3 < 0x42) {
            if (ZVar3 == ZSTD_error_parameter_outOfBound) {
              local_74 = KTX_INVALID_VALUE;
            }
            else {
              bVar11 = ZVar3 == ZSTD_error_memory_allocation;
LAB_00263864:
              if (bVar11) {
                local_74 = KTX_OUT_OF_MEMORY;
              }
              else {
                local_74 = KTX_INVALID_OPERATION;
              }
            }
          }
          else {
            if (ZVar3 != ZSTD_error_workSpace_tooSmall) {
              bVar11 = ZVar3 == ZSTD_error_dstSize_tooSmall;
              goto LAB_00263864;
            }
            local_74 = KTX_OUT_OF_MEMORY;
          }
        }
      } while (uVar2 == 0);
      if (iVar6 != 5) {
        if (iVar6 != 6) {
          return local_74;
        }
        ZSTD_freeCCtx(cctx);
        __dest = (ktx_uint8_t *)malloc(local_48);
        if (__dest != (ktx_uint8_t *)0x0) {
          memcpy(__dest,(void *)((long)__ptr + __n),local_48);
          memcpy(__dest_00,__ptr,__n);
          free(__ptr);
          free(This->pData);
          This->pData = __dest;
          This->dataSize = local_48;
          This->supercompressionScheme = KTX_SS_ZSTD;
          This->_private->_requiredLevelAlignment = 1;
          return KTX_SUCCESS;
        }
        free(__ptr);
        goto LAB_0026395d;
      }
    }
    ZSTD_freeCCtx(cctx);
    free(__ptr);
  }
  return local_74;
}

Assistant:

KTX_error_code
ktxTexture2_DeflateZstd(ktxTexture2* This, ktx_uint32_t compressionLevel)
{
    ktx_uint32_t levelIndexByteLength =
                            This->numLevels * sizeof(ktxLevelIndexEntry);
    ktx_uint8_t* workBuf;
    ktx_uint8_t* cmpData;
    ktx_size_t dstRemainingByteLength = 0;
    ktx_size_t byteLengthCmp = 0;
    ktx_size_t levelOffset = 0;
    ktxLevelIndexEntry* cindex = This->_private->_levelIndex;
    ktxLevelIndexEntry* nindex;
    ktx_uint8_t* pCmpDst;
    ktx_error_code_e result;

    ZSTD_CCtx* cctx = ZSTD_createCCtx();
    if (cctx == NULL)
        return KTX_OUT_OF_MEMORY;

    if (This->supercompressionScheme != KTX_SS_NONE)
        return KTX_INVALID_OPERATION;

    // On rare occasions the deflated data can be a few bytes larger than
    // the source data. Calculating the dst buffer size using
    // ZSTD_compressBound provides a suitable size plus compression is said
    // to run faster when the dst buffer is >= compressBound.
    for (int32_t level = This->numLevels - 1; level >= 0; level--) {
        dstRemainingByteLength += ZSTD_compressBound(cindex[level].byteLength);
    }

    workBuf = malloc(dstRemainingByteLength + levelIndexByteLength);
    if (workBuf == NULL) {
        result = KTX_OUT_OF_MEMORY;
        goto cleanup;
    }
    nindex = (ktxLevelIndexEntry*)workBuf;
    pCmpDst = &workBuf[levelIndexByteLength];

    for (int32_t level = This->numLevels - 1; level >= 0; level--) {
        size_t levelByteLengthCmp =
            ZSTD_compressCCtx(cctx, pCmpDst + levelOffset,
                              dstRemainingByteLength,
                              &This->pData[cindex[level].byteOffset],
                              cindex[level].byteLength,
                              compressionLevel);
        if (ZSTD_isError(levelByteLengthCmp)) {
            free(workBuf);
            ZSTD_ErrorCode error = ZSTD_getErrorCode(levelByteLengthCmp);
            switch(error) {
              case ZSTD_error_parameter_outOfBound:
                result = KTX_INVALID_VALUE;
                goto cleanup;
              case ZSTD_error_dstSize_tooSmall:
#ifdef DEBUG
                assert(false && "Deflate dstSize too small.");
#else
                result = KTX_OUT_OF_MEMORY;
                goto cleanup;
#endif
              case ZSTD_error_workSpace_tooSmall:
#ifdef DEBUG
                assert(false && "Deflate workspace too small.");
#else
                result = KTX_OUT_OF_MEMORY;
                goto cleanup;
#endif
              case ZSTD_error_memory_allocation:
                result = KTX_OUT_OF_MEMORY;
                goto cleanup;
              default:
                // The remaining errors look like they should only
                // occur during decompression but just in case.
#ifdef DEBUG
                assert(true);
#else
                result = KTX_INVALID_OPERATION;
                goto cleanup;
#endif
            }
        }
        nindex[level].byteOffset = levelOffset;
        nindex[level].uncompressedByteLength = cindex[level].byteLength;
        nindex[level].byteLength = levelByteLengthCmp;
        byteLengthCmp += levelByteLengthCmp;
        levelOffset += levelByteLengthCmp;
        dstRemainingByteLength -= levelByteLengthCmp;
    }
    ZSTD_freeCCtx(cctx);

    // Move the compressed data into a correctly sized buffer.
    cmpData = malloc(byteLengthCmp);
    if (cmpData == NULL) {
        free(workBuf);
        return KTX_OUT_OF_MEMORY;
    }
    // Now modify the texture.
    memcpy(cmpData, pCmpDst, byteLengthCmp); // Copy data to sized buffer.
    memcpy(cindex, nindex, levelIndexByteLength); // Update level index
    free(workBuf);
    free(This->pData);
    This->pData = cmpData;
    This->dataSize = byteLengthCmp;
    This->supercompressionScheme = KTX_SS_ZSTD;
    This->_private->_requiredLevelAlignment = 1;

    return KTX_SUCCESS;

cleanup:
    ZSTD_freeCCtx(cctx);
    free(workBuf);
    return result;
}